

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O2

void __thiscall CSocekt::clearMsgSendQueue(CSocekt *this)

{
  _List_node_base *p_Var1;
  CMemory *this_00;
  list<char_*,_std::allocator<char_*>_> *this_01;
  
  this_00 = CMemory::GetInstance();
  this_01 = &this->m_MsgSendQueue;
  while (p_Var1 = (this_01->super__List_base<char_*,_std::allocator<char_*>_>)._M_impl._M_node.
                  super__List_node_base._M_next, p_Var1 != (_List_node_base *)this_01) {
    p_Var1 = p_Var1[1]._M_next;
    std::__cxx11::list<char_*,_std::allocator<char_*>_>::pop_front(this_01);
    CMemory::FreeMemory(this_00,p_Var1);
  }
  return;
}

Assistant:

void CSocekt::clearMsgSendQueue()
{
	char * sTmpMempoint;
	CMemory *p_memory = CMemory::GetInstance();
	
	while(!m_MsgSendQueue.empty())
	{
		sTmpMempoint = m_MsgSendQueue.front();
		m_MsgSendQueue.pop_front(); 
		p_memory->FreeMemory(sTmpMempoint);
	}	
}